

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,aiMaterial *pcMatOut,uint iType,
          uint iWidth,uint iHeight)

{
  uint *puVar1;
  aiScene *paVar2;
  long lVar3;
  unique_ptr<aiTexture,_std::default_delete<aiTexture>_> uVar4;
  uint i;
  size_t sVar5;
  pointer paVar6;
  size_t sVar7;
  aiTexture **ppaVar8;
  ulong uVar9;
  aiTexture **ppaVar10;
  Logger *pLVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  char cVar19;
  MDLImporter *pMVar20;
  Material_MDL7 *pcMatIn;
  bool bVar21;
  bool bVar22;
  float fVar23;
  unique_ptr<aiTexture,_std::default_delete<aiTexture>_> pcNew;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  int iShadingMode;
  undefined1 local_458 [16];
  uchar **local_448;
  float power;
  int referrer;
  undefined1 uStack_434;
  undefined1 auStack_433 [3];
  float local_430;
  
  pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
  super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
  super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiTexture,_std::default_delete<aiTexture>,_true,_true>)
       (__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)0x0;
  uVar16 = iType & 0xf;
  pMVar20 = (MDLImporter *)pcMatOut;
  local_448 = szCurrentOut;
  if (uVar16 == 7) {
    if (iHeight != 1) {
      pLVar11 = DefaultLogger::get();
      Logger::warn(pLVar11,
                   "Found a reference to an external texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    uStack_434 = '\0';
    memset(auStack_433,0x1b,0x3ff);
    sVar5 = strlen((char *)szCurrent);
    sVar7 = 0x400;
    if (sVar5 + 1 < 0x400) {
      sVar7 = sVar5 + 1;
    }
    memcpy(&uStack_434,szCurrent,sVar7);
    _referrer = CONCAT44(_uStack_434,(int)sVar5);
    aiMaterial::AddProperty(pcMatOut,(aiString *)&referrer,"$tex.file",1,0);
    szCurrent = szCurrent + sVar7;
    goto LAB_0043dec6;
  }
  if (uVar16 == 6) {
    if (iHeight != 1) {
      pLVar11 = DefaultLogger::get();
      Logger::warn(pLVar11,
                   "Found a reference to an embedded DDS texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    paVar6 = (pointer)operator_new(0x428);
    paVar6->mWidth = 0;
    paVar6->mHeight = 0;
    paVar6->pcData = (aiTexel *)0x0;
    (paVar6->mFilename).length = 0;
    (paVar6->mFilename).data[0] = '\0';
    memset((paVar6->mFilename).data + 1,0x1b,0x3ff);
    paVar6->achFormatHint[0] = '\0';
    paVar6->achFormatHint[1] = '\0';
    paVar6->achFormatHint[2] = '\0';
    paVar6->achFormatHint[3] = '\0';
    std::__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> *)&pcNew,paVar6);
    uVar4 = pcNew;
    *(undefined4 *)
     ((long)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
            super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
            super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl + 4) = 0;
    *(uint *)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
             super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
             super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl = iWidth;
    *(undefined4 *)
     ((long)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
            super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
            super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl + 8) = 0x736464;
    pMVar20 = (MDLImporter *)
              operator_new__((ulong)*(uint *)pcNew._M_t.
                                             super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>
                                             .super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl
                            );
    *(MDLImporter **)
     ((long)uVar4._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
            super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
            super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl + 0x18) = pMVar20;
    memcpy(pMVar20,szCurrent,
           (ulong)*(uint *)uVar4._M_t.
                           super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
                           super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
                           super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl);
    uVar9 = (ulong)iWidth;
  }
  else {
    if (uVar16 == 1) {
      _referrer = CONCAT44(_uStack_434,iWidth);
      aiMaterial::AddProperty<int>(pcMatOut,&referrer,1,"&&&referrer&&&",0,0);
      goto LAB_0043dec6;
    }
    pMVar20 = this;
    if ((iType != 0 && uVar16 == 0) && (iHeight == 0 || iWidth == 0)) goto LAB_0043dec6;
    paVar6 = (pointer)operator_new(0x428);
    paVar6->mWidth = 0;
    paVar6->mHeight = 0;
    paVar6->pcData = (aiTexel *)0x0;
    (paVar6->mFilename).length = 0;
    (paVar6->mFilename).data[0] = '\0';
    memset((paVar6->mFilename).data + 1,0x1b,0x3ff);
    paVar6->achFormatHint[0] = '\0';
    paVar6->achFormatHint[1] = '\0';
    paVar6->achFormatHint[2] = '\0';
    paVar6->achFormatHint[3] = '\0';
    std::__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> *)&pcNew,paVar6);
    if (iWidth == 0 || iHeight == 0) {
      pLVar11 = DefaultLogger::get();
      Logger::warn(pLVar11,
                   "Found embedded texture, but its width an height are both 0. Is this a joke?");
      *(undefined4 *)
       ((long)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
              super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
              super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl + 4) = 8;
      *(undefined4 *)
       pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
       super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
       super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl = 8;
      pMVar20 = (MDLImporter *)0x100;
      pvVar12 = operator_new__(0x100);
      *(void **)((long)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>.
                       _M_t.super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
                       super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl + 0x18) = pvVar12;
      lVar13 = 3;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        lVar15 = lVar13;
        for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
          uVar9 = (ulong)((uint)lVar14 ^ (uint)lVar18) & 0xffffffffffffff01;
          cVar19 = -(char)uVar9;
          pMVar20 = (MDLImporter *)CONCAT71((int7)(uVar9 >> 8),cVar19);
          lVar3 = *(long *)((long)pcNew._M_t.
                                  super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>
                                  .super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl + 0x18);
          *(char *)(lVar3 + -2 + lVar15) = cVar19;
          *(char *)(lVar3 + -3 + lVar15) = cVar19;
          *(char *)(lVar3 + -1 + lVar15) = cVar19;
          *(undefined1 *)(lVar3 + lVar15) = 0xff;
          lVar15 = lVar15 + 0x20;
        }
        lVar13 = lVar13 + 4;
      }
      goto LAB_0043dec6;
    }
    *(uint *)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
             super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
             super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl = iWidth;
    *(uint *)((long)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>.
                    _M_t.super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
                    super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl + 4) = iHeight;
    _referrer = _referrer & 0xffffffff00000000;
    ParseTextureColorData
              (this,szCurrent,uVar16,(uint *)&referrer,
               (aiTexture *)
               pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
               super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
               super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl);
    uVar9 = _referrer & 0xffffffff;
  }
  szCurrent = szCurrent + uVar9;
LAB_0043dec6:
  local_478._0_4_ = 0.0;
  local_478._4_4_ = 0.0;
  fStack_470 = 0.0;
  fStack_46c = 0.0;
  if ((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)
      pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
      super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
      super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)0x0) {
    stack0xfffffffffffffb8c = SUB1612((undefined1  [16])0x0,4);
    local_478._0_4_ = NAN;
    fVar23 = NAN;
  }
  else {
    _local_478 = ReplaceTextureWithColor
                           (pMVar20,(aiTexture *)
                                    pcNew._M_t.
                                    super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>
                                    .super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl);
    fVar23 = local_478._0_4_;
  }
  if ((iType & 0x10) == 0) {
    uVar16 = (uint)fVar23 & 0x7fffff;
    uVar17 = 0x7f800000;
    if ((~(uint)fVar23 & 0x7f800000) != 0 || uVar16 == 0) {
      aiMaterial::AddProperty<aiColor4t<float>>
                (pcMatOut,(aiColor4D *)local_478,1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty<aiColor4t<float>>
                (pcMatOut,(aiColor4D *)local_478,1,"$clr.specular",0,0);
      uVar17 = local_478._0_4_ & 0x7f800000;
      uVar16 = local_478._0_4_ & 0x7fffff;
    }
  }
  else {
    SizeCheck(this,(int *)((long)szCurrent + 0x44),
              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x25b);
    _referrer = *(ulong *)szCurrent;
    local_430 = *(float *)((long)szCurrent + 8);
    local_458 = ZEXT416((uint)local_478._0_4_);
    uVar17 = local_478._0_4_ & 0x7f800000;
    bVar21 = uVar17 != 0x7f800000;
    uVar16 = local_478._0_4_ & 0x7fffff;
    bVar22 = ((undefined1  [16])_local_478 & (undefined1  [16])0x7fffff) == (undefined1  [16])0x0;
    if (bVar22 || bVar21) {
      fVar23 = (float)_referrer;
      _uStack_434 = (float)local_478._4_4_ * SUB84(_referrer,4);
      referrer = (int)((float)local_478._0_4_ * fVar23);
      local_430 = local_430 * fStack_470;
    }
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&referrer,1,"$clr.diffuse",0,0);
    _referrer = *(ulong *)((long)szCurrent + 0x20);
    local_430 = *(float *)((long)szCurrent + 0x28);
    if (bVar22 || bVar21) {
      fVar23 = (float)_referrer;
      _uStack_434 = (float)local_478._4_4_ * SUB84(_referrer,4);
      referrer = (int)((float)local_458._0_4_ * fVar23);
      local_430 = local_430 * fStack_470;
    }
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&referrer,1,"$clr.specular",0,0);
    _referrer = *(ulong *)((long)szCurrent + 0x10);
    local_430 = *(float *)((long)szCurrent + 0x18);
    if (bVar22 || bVar21) {
      fVar23 = (float)_referrer;
      _uStack_434 = (float)local_478._4_4_ * SUB84(_referrer,4);
      referrer = (int)((float)local_458._0_4_ * fVar23);
      local_430 = local_430 * fStack_470;
    }
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&referrer,1,"$clr.ambient",0,0);
    _referrer = *(ulong *)((long)szCurrent + 0x30);
    local_430 = *(ai_real *)((long)szCurrent + 0x38);
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&referrer,1,"$clr.emissive",0,0);
    fVar23 = *(float *)((long)szCurrent + 0x1c);
    if (bVar22 || bVar21) {
      fVar23 = fVar23 * fStack_46c;
    }
    _referrer = CONCAT44(_uStack_434,fVar23);
    aiMaterial::AddProperty<float>(pcMatOut,(float *)&referrer,1,"$mat.opacity",0,0);
    iShadingMode = 2;
    fVar23 = *(float *)((long)szCurrent + 0x40);
    if ((fVar23 != 0.0) || (NAN(fVar23))) {
      iShadingMode = 3;
      power = fVar23;
      aiMaterial::AddProperty<float>(pcMatOut,&power,1,"$mat.shininess",0,0);
    }
    aiMaterial::AddProperty<int>(pcMatOut,&iShadingMode,1,"$mat.shadingm",0,0);
    szCurrent = (uchar *)((long)szCurrent + 0x44);
  }
  if ((uVar17 != 0x7f800000) || (uVar16 == 0)) {
    std::__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> *)&pcNew,(pointer)0x0);
  }
  if ((iType & 0x20) != 0) {
    SizeCheck(this,szCurrent,
              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2b6);
    szCurrent = (uchar *)((long)szCurrent + (long)*(int *)szCurrent + 4);
    SizeCheck(this,szCurrent,
              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2ba);
  }
  if (((__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)
       pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
       super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
       super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)0x0) &&
     (this->pScene->mNumTextures < 1000)) {
    snprintf((char *)&iShadingMode,5,"*%i");
    uStack_434 = '\0';
    memset(auStack_433,0x1b,0x3ff);
    sVar7 = strlen((char *)&iShadingMode);
    memcpy(&uStack_434,&iShadingMode,sVar7 + 1);
    _referrer = CONCAT44(_uStack_434,(int)sVar7);
    aiMaterial::AddProperty(pcMatOut,(aiString *)&referrer,"$tex.file",1,0);
    paVar2 = this->pScene;
    if (paVar2->mNumTextures == 0) {
      paVar2->mNumTextures = 1;
      ppaVar10 = (aiTexture **)operator_new__(8);
      uVar4 = pcNew;
      this->pScene->mTextures = ppaVar10;
      pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
      super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
      super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiTexture,_std::default_delete<aiTexture>,_true,_true>)
           (__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)0x0;
      ((__uniq_ptr_data<aiTexture,_std::default_delete<aiTexture>,_true,_true> *)
      this->pScene->mTextures)->super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> =
           (__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)
           uVar4._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
           super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
           super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl;
    }
    else {
      ppaVar10 = paVar2->mTextures;
      ppaVar8 = (aiTexture **)operator_new__((ulong)(paVar2->mNumTextures + 1) << 3);
      uVar4 = pcNew;
      paVar2->mTextures = ppaVar8;
      uVar9 = 0;
      while( true ) {
        paVar2 = this->pScene;
        if (paVar2->mNumTextures <= uVar9) break;
        paVar2->mTextures[uVar9] = ppaVar10[uVar9];
        uVar9 = uVar9 + 1;
      }
      pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
      super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
      super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl =
           (__uniq_ptr_data<aiTexture,_std::default_delete<aiTexture>,_true,_true>)
           (__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)0x0;
      ((__uniq_ptr_data<aiTexture,_std::default_delete<aiTexture>,_true,_true> *)
      (paVar2->mTextures + paVar2->mNumTextures))->
      super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_> =
           (__uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>)
           uVar4._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
           super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
           super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl;
      puVar1 = &this->pScene->mNumTextures;
      *puVar1 = *puVar1 + 1;
      if (ppaVar10 != (aiTexture **)0x0) {
        operator_delete__(ppaVar10);
      }
    }
  }
  SizeCheck(this,szCurrent,
            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x2e1);
  *local_448 = szCurrent;
  std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::~unique_ptr(&pcNew);
  return;
}

Assistant:

void MDLImporter::ParseSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    aiMaterial* pcMatOut,
    unsigned int iType,
    unsigned int iWidth,
    unsigned int iHeight)
{
    std::unique_ptr<aiTexture> pcNew;

    // get the type of the skin
    unsigned int iMasked = (unsigned int)(iType & 0xF);

    if (0x1 ==  iMasked)
    {
        // ***** REFERENCE TO ANOTHER SKIN INDEX *****
        int referrer = (int)iWidth;
        pcMatOut->AddProperty<int>(&referrer,1,AI_MDL7_REFERRER_MATERIAL);
    }
    else if (0x6 == iMasked)
    {
        // ***** EMBEDDED DDS FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an embedded DDS texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        pcNew.reset(new aiTexture());
        pcNew->mHeight = 0;
        pcNew->mWidth = iWidth;

        // place a proper format hint
        pcNew->achFormatHint[0] = 'd';
        pcNew->achFormatHint[1] = 'd';
        pcNew->achFormatHint[2] = 's';
        pcNew->achFormatHint[3] = '\0';

        pcNew->pcData = (aiTexel*) new unsigned char[pcNew->mWidth];
        memcpy(pcNew->pcData,szCurrent,pcNew->mWidth);
        szCurrent += iWidth;
    }
    else if (0x7 == iMasked)
    {
        // ***** REFERENCE TO EXTERNAL FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an external texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        size_t iLen2 = iLen+1;
        iLen2 = iLen2 > MAXLEN ? MAXLEN : iLen2;
        memcpy(szFile.data,(const char*)szCurrent,iLen2);
        szFile.length = iLen;

        szCurrent += iLen2;

        // place this as diffuse texture
        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));
    }
    else if (iMasked || !iType || (iType && iWidth && iHeight))
    {
        pcNew.reset(new aiTexture());
        if (!iHeight || !iWidth)
        {
            ASSIMP_LOG_WARN("Found embedded texture, but its width "
                "an height are both 0. Is this a joke?");

            // generate an empty chess pattern
            pcNew->mWidth = pcNew->mHeight = 8;
            pcNew->pcData = new aiTexel[64];
            for (unsigned int x = 0; x < 8;++x)
            {
                for (unsigned int y = 0; y < 8;++y)
                {
                    const bool bSet = ((0 == x % 2 && 0 != y % 2) ||
                        (0 != x % 2 && 0 == y % 2));

                    aiTexel* pc = &pcNew->pcData[y * 8 + x];
                    pc->r = pc->b = pc->g = (bSet?0xFF:0);
                    pc->a = 0xFF;
                }
            }
        }
        else
        {
            // it is a standard color texture. Fill in width and height
            // and call the same function we used for loading MDL5 files

            pcNew->mWidth = iWidth;
            pcNew->mHeight = iHeight;

            unsigned int iSkip = 0;
            ParseTextureColorData(szCurrent,iMasked,&iSkip,pcNew.get());

            // skip length of texture data
            szCurrent += iSkip;
        }
    }

    // sometimes there are MDL7 files which have a monochrome
    // texture instead of material colors ... posssible they have
    // been converted to MDL7 from other formats, such as MDL5
    aiColor4D clrTexture;
    if (pcNew)clrTexture = ReplaceTextureWithColor(pcNew.get());
    else clrTexture.r = get_qnan();

    // check whether a material definition is contained in the skin
    if (iType & AI_MDL7_SKINTYPE_MATERIAL)
    {
        BE_NCONST MDL::Material_MDL7* pcMatIn = (BE_NCONST MDL::Material_MDL7*)szCurrent;
        szCurrent = (unsigned char*)(pcMatIn+1);
        VALIDATE_FILE_SIZE(szCurrent);

        aiColor3D clrTemp;

#define COLOR_MULTIPLY_RGB() \
    if (is_not_qnan(clrTexture.r)) \
        { \
        clrTemp.r *= clrTexture.r; \
        clrTemp.g *= clrTexture.g; \
        clrTemp.b *= clrTexture.b; \
        }

        // read diffuse color
        clrTemp.r = pcMatIn->Diffuse.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Diffuse.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Diffuse.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_DIFFUSE);

        // read specular color
        clrTemp.r = pcMatIn->Specular.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Specular.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Specular.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_SPECULAR);

        // read ambient color
        clrTemp.r = pcMatIn->Ambient.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Ambient.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Ambient.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_AMBIENT);

        // read emissive color
        clrTemp.r = pcMatIn->Emissive.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Emissive.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Emissive.b;
        AI_SWAP4(clrTemp.b);
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_EMISSIVE);

#undef COLOR_MULITPLY_RGB

        // FIX: Take the opacity from the ambient color.
        // The doc say something else, but it is fact that MED exports the
        // opacity like this .... oh well.
        clrTemp.r = pcMatIn->Ambient.a;
        AI_SWAP4(clrTemp.r);
        if (is_not_qnan(clrTexture.r)) {
            clrTemp.r *= clrTexture.a;
        }
        pcMatOut->AddProperty<ai_real>(&clrTemp.r,1,AI_MATKEY_OPACITY);

        // read phong power
        int iShadingMode = (int)aiShadingMode_Gouraud;
        AI_SWAP4(pcMatIn->Power);
        if (0.0f != pcMatIn->Power)
        {
            iShadingMode = (int)aiShadingMode_Phong;
            // pcMatIn is packed, we can't form pointers to its members
            float power = pcMatIn->Power;
            pcMatOut->AddProperty<float>(&power,1,AI_MATKEY_SHININESS);
        }
        pcMatOut->AddProperty<int>(&iShadingMode,1,AI_MATKEY_SHADING_MODEL);
    }
    else if (is_not_qnan(clrTexture.r))
    {
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_DIFFUSE);
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_SPECULAR);
    }
    // if the texture could be replaced by a single material color
    // we don't need the texture anymore
    if (is_not_qnan(clrTexture.r))
    {
        pcNew.reset();
    }

    // If an ASCII effect description (HLSL?) is contained in the file,
    // we can simply ignore it ...
    if (iType & AI_MDL7_SKINTYPE_MATERIAL_ASCDEF)
    {
        VALIDATE_FILE_SIZE(szCurrent);
        int32_t iMe = *((int32_t*)szCurrent);
        AI_SWAP4(iMe);
        szCurrent += sizeof(char) * iMe + sizeof(int32_t);
        VALIDATE_FILE_SIZE(szCurrent);
    }

    // If an embedded texture has been loaded setup the corresponding
    // data structures in the aiScene instance
    if (pcNew && pScene->mNumTextures <= 999)
    {

        // place this as diffuse texture
        char szCurrent[5];
        ai_snprintf(szCurrent,5,"*%i",this->pScene->mNumTextures);

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        ::memcpy(szFile.data,(const char*)szCurrent,iLen+1);
        szFile.length = iLen;

        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));

        // store the texture
        if (!pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew.release();
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < pScene->mNumTextures;++i) {
                pScene->mTextures[i] = pc[i];
            }

            pScene->mTextures[pScene->mNumTextures] = pcNew.release();
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    VALIDATE_FILE_SIZE(szCurrent);
    *szCurrentOut = szCurrent;
}